

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  pcp_flow_event_e pVar1;
  long lVar2;
  long lVar3;
  timeval ctv;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  lVar2 = (f->timeout).tv_usec;
  lVar3 = lVar2 / 1000000 + (f->timeout).tv_sec;
  (f->timeout).tv_sec = lVar3;
  lVar2 = lVar2 % 1000000;
  (f->timeout).tv_usec = lVar2;
  if (lVar2 < 0) {
    (f->timeout).tv_usec = lVar2 + 1000000;
    (f->timeout).tv_sec = lVar3 + -1;
  }
  local_18.tv_sec = local_18.tv_usec / 1000000 + local_18.tv_sec;
  local_18.tv_usec = local_18.tv_usec % 1000000;
  if (local_18.tv_usec < 0) {
    local_18.tv_usec = local_18.tv_usec + 1000000;
    local_18.tv_sec = local_18.tv_sec + -1;
  }
  pVar1 = fev_failed;
  lVar2 = (f->timeout).tv_sec;
  if ((local_18.tv_sec <= lVar2) && (pVar1 = fev_none, lVar2 <= local_18.tv_sec)) {
    pVar1 = (f->timeout).tv_usec < local_18.tv_usec ^ fev_none;
  }
  return pVar1;
}

Assistant:

static pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,
                                       UNUSED pcp_recv_msg_t *msg) {
    struct timeval ctv;

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) < 0) {
        return fev_failed;
    }

    return fev_none;
}